

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O1

void __thiscall Refal2::CFunctionBuilder::AddEndOfLeft(CFunctionBuilder *this)

{
  CNodeType *pCVar1;
  CNodeType *pCVar2;
  CNodeType *pCVar3;
  bool bVar4;
  
  if ((this->super_CVariablesBuilder).field_0x1aac != '\0') {
    error(this,EC_ThereAreMultiplePartsSeparatorInRules);
    return;
  }
  if ((this->balanceStack).c.
      super__Deque_base<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->balanceStack).c.
      super__Deque_base<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::deque<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>::
      pop_back(&(this->balanceStack).c);
      error(this,EC_UnclosedLeftParenInLeftPart);
    } while ((this->balanceStack).c.
             super__Deque_base<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->balanceStack).c.
             super__Deque_base<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  bVar4 = CErrorsHelper::HasErrors((CErrorsHelper *)this);
  if (bVar4) {
    pCVar1 = (this->acc).super_CNodeList<Refal2::CUnit>.first;
    if (pCVar1 != (CNodeType *)0x0) {
      CNodeList<Refal2::CUnit>::Remove
                (&(this->acc).super_CNodeList<Refal2::CUnit>,pCVar1,
                 (this->acc).super_CNodeList<Refal2::CUnit>.last);
    }
    (this->acc).super_CNodeList<Refal2::CUnit>.first = (CNodeType *)0x0;
    (this->acc).super_CNodeList<Refal2::CUnit>.last = (CNodeType *)0x0;
  }
  else {
    pCVar1 = (this->leftPart).super_CNodeList<Refal2::CUnit>.first;
    if (pCVar1 != (CNodeType *)0x0) {
      CNodeList<Refal2::CUnit>::Remove
                (&(this->leftPart).super_CNodeList<Refal2::CUnit>,pCVar1,
                 (this->leftPart).super_CNodeList<Refal2::CUnit>.last);
    }
    (this->leftPart).super_CNodeList<Refal2::CUnit>.first = (CNodeType *)0x0;
    (this->leftPart).super_CNodeList<Refal2::CUnit>.last = (CNodeType *)0x0;
    pCVar2 = (this->acc).super_CNodeList<Refal2::CUnit>.first;
    pCVar3 = (this->acc).super_CNodeList<Refal2::CUnit>.last;
    (this->acc).super_CNodeList<Refal2::CUnit>.first = (CNodeType *)0x0;
    pCVar1 = (this->leftPart).super_CNodeList<Refal2::CUnit>.last;
    (this->leftPart).super_CNodeList<Refal2::CUnit>.first = pCVar2;
    (this->leftPart).super_CNodeList<Refal2::CUnit>.last = pCVar3;
    (this->acc).super_CNodeList<Refal2::CUnit>.last = pCVar1;
  }
  (this->super_CVariablesBuilder).field_0x1aac = 1;
  return;
}

Assistant:

void CFunctionBuilder::AddEndOfLeft()
{
	if( isProcessRightPart ) {
		error( EC_ThereAreMultiplePartsSeparatorInRules );
	} else {
		while( !balanceStack.empty() ) {
			balanceStack.pop();
			error( EC_UnclosedLeftParenInLeftPart );
		}
		if( HasErrors() ) {
			acc.Empty();
		} else {
			acc.Move( leftPart );
		}
		isProcessRightPart = true;
	}
}